

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

void * ma_offset_pcm_frames_ptr
                 (void *p,ma_uint64 offsetInFrames,ma_format format,ma_uint32 channels)

{
  return (void *)((channels * *(int *)(&DAT_001ad680 + (ulong)format * 4)) * offsetInFrames +
                 (long)p);
}

Assistant:

MA_API ma_uint32 ma_get_bytes_per_sample(ma_format format)
{
    ma_uint32 sizes[] = {
        0,  /* unknown */
        1,  /* u8 */
        2,  /* s16 */
        3,  /* s24 */
        4,  /* s32 */
        4,  /* f32 */
    };
    return sizes[format];
}